

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixFileControl(sqlite3_file *id,int op,void *pArg)

{
  int iVar1;
  uint uVar2;
  long nMap;
  sqlite3_io_methods *psVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  uint *puVar9;
  int iErrno;
  long lVar10;
  sqlite3_io_methods *psVar11;
  long iOff;
  long lVar12;
  long lVar13;
  stat buf;
  undefined1 local_c0 [8];
  _func_int_sqlite3_file_ptr *local_b8;
  long local_90;
  int local_88;
  
  iVar6 = 0xc;
  switch(op) {
  case 1:
    uVar7 = (uint)*(byte *)((long)&id[3].pMethods + 4);
    goto LAB_0015b4db;
  case 4:
    uVar7 = *(uint *)&id[4].pMethods;
    goto LAB_0015b4db;
  case 5:
    nMap = *pArg;
    if (0 < *(int *)&id[9].pMethods) {
      iVar6 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&id[3].pMethods,local_c0);
      if (iVar6 != 0) {
        return 0x70a;
      }
      lVar13 = nMap + *(int *)&id[9].pMethods + -1;
      lVar13 = lVar13 - lVar13 % (long)*(int *)&id[9].pMethods;
      if (local_90 < lVar13) {
        lVar10 = (long)local_88;
        iOff = local_90 + lVar10 + ~(local_90 % lVar10);
        lVar12 = lVar13 + lVar10 + -1;
        if (iOff < lVar12) {
          do {
            if (lVar13 <= iOff) {
              iOff = lVar13 + -1;
            }
            iVar6 = seekAndWriteFd(*(int *)&id[3].pMethods,iOff,"",1,(int *)(id + 4));
            if (iVar6 != 1) {
              return 0x30a;
            }
            iOff = iOff + lVar10;
          } while (iOff < lVar12);
        }
      }
    }
    iVar6 = 0;
    if ((0 < (long)id[0xc].pMethods) && ((long)id[10].pMethods < nMap)) {
      if (*(int *)&id[9].pMethods < 1) {
        uVar7 = *(uint *)&id[3].pMethods;
        do {
          iVar6 = (*aSyscall[6].pCurrent)((ulong)uVar7,nMap);
          if (-1 < iVar6) {
            if (iVar6 == 0) goto LAB_0015b344;
            puVar9 = (uint *)__errno_location();
            uVar2 = *puVar9;
            break;
          }
          puVar9 = (uint *)__errno_location();
          uVar2 = *puVar9;
        } while (uVar2 == 4);
        *(uint *)&id[4].pMethods = uVar2;
        psVar11 = id[7].pMethods;
        if (psVar11 == (sqlite3_io_methods *)0x0) {
          psVar11 = (sqlite3_io_methods *)0x1dc0d0;
        }
        iVar6 = 0x60a;
        sqlite3_log(0x60a,"os_unix.c:%d: (%d) %s(%s) - %s",0x8e6a,(ulong)uVar2,"ftruncate",psVar11,
                    "");
      }
      else {
LAB_0015b344:
        iVar6 = unixMapfile((unixFile *)id,nMap);
      }
    }
    break;
  case 6:
    *(undefined4 *)&id[9].pMethods = *pArg;
    goto LAB_0015b4f0;
  case 10:
    if (*pArg < 0) {
      uVar4 = *(ushort *)((long)&id[3].pMethods + 6) >> 2;
      goto LAB_0015b4d8;
    }
    uVar4 = *(ushort *)((long)&id[3].pMethods + 6);
    if (*pArg == 0) {
      uVar4 = uVar4 & 0xfffb;
    }
    else {
      uVar4 = uVar4 | 4;
    }
LAB_0015b4ec:
    *(ushort *)((long)&id[3].pMethods + 6) = uVar4;
    goto LAB_0015b4f0;
  case 0xc:
    iVar6 = 0;
    pcVar8 = sqlite3_mprintf("%s",(id[1].pMethods)->xWrite);
    *(char **)pArg = pcVar8;
    break;
  case 0xd:
    if (-1 < *pArg) {
      uVar4 = *(ushort *)((long)&id[3].pMethods + 6);
      if (*pArg == 0) {
        uVar4 = uVar4 & 0xffef;
      }
      else {
        uVar4 = uVar4 | 0x10;
      }
      goto LAB_0015b4ec;
    }
    uVar4 = *(ushort *)((long)&id[3].pMethods + 6) >> 4;
LAB_0015b4d8:
    uVar7 = uVar4 & 1;
LAB_0015b4db:
    *(uint *)pArg = uVar7;
LAB_0015b4f0:
    iVar6 = 0;
    break;
  case 0x10:
    iVar1 = *(int *)&(id[1].pMethods)->xClose;
    iVar5 = sqlite3_initialize();
    iVar6 = 0;
    if ((iVar5 == 0) && (pcVar8 = (char *)sqlite3Malloc((long)iVar1), pcVar8 != (char *)0x0)) {
      unixGetTempname(*(int *)&(id[1].pMethods)->xClose,pcVar8);
      *(char **)pArg = pcVar8;
    }
    break;
  case 0x12:
    psVar11 = (sqlite3_io_methods *)sqlite3Config.mxMmap;
    if ((long)*pArg < sqlite3Config.mxMmap) {
      psVar11 = *pArg;
    }
    psVar3 = id[0xc].pMethods;
    *(sqlite3_io_methods **)pArg = psVar3;
    iVar6 = 0;
    if (((psVar11 != psVar3 && -1 < (long)psVar11) && (*(int *)((long)&id[9].pMethods + 4) == 0)) &&
       (id[0xc].pMethods = psVar11, iVar6 = 0, 0 < (long)id[10].pMethods)) {
      if (id[0xd].pMethods != (sqlite3_io_methods *)0x0) {
        (*aSyscall[0x17].pCurrent)(id[0xd].pMethods,id[0xb].pMethods);
        id[0xd].pMethods = (sqlite3_io_methods *)0x0;
        id[10].pMethods = (sqlite3_io_methods *)0x0;
        id[0xb].pMethods = (sqlite3_io_methods *)0x0;
      }
      iVar6 = unixMapfile((unixFile *)id,-1);
      return iVar6;
    }
    break;
  case 0x14:
    uVar7 = 0;
    if (id[2].pMethods != (sqlite3_io_methods *)0x0) {
      iVar6 = (*aSyscall[4].pCurrent)(id[7].pMethods,local_c0);
      uVar7 = 1;
      if (iVar6 == 0) {
        uVar7 = (uint)(local_b8 != (id[2].pMethods)->xClose);
      }
    }
    *(uint *)pArg = uVar7;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int unixFileControl(sqlite3_file *id, int op, void *pArg){
  unixFile *pFile = (unixFile*)id;
  switch( op ){
#if defined(__linux__) && defined(SQLITE_ENABLE_BATCH_ATOMIC_WRITE)
    case SQLITE_FCNTL_BEGIN_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_START_ATOMIC_WRITE);
      return rc ? SQLITE_IOERR_BEGIN_ATOMIC : SQLITE_OK;
    }
    case SQLITE_FCNTL_COMMIT_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_COMMIT_ATOMIC_WRITE);
      return rc ? SQLITE_IOERR_COMMIT_ATOMIC : SQLITE_OK;
    }
    case SQLITE_FCNTL_ROLLBACK_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_ABORT_VOLATILE_WRITE);
      return rc ? SQLITE_IOERR_ROLLBACK_ATOMIC : SQLITE_OK;
    }
#endif /* __linux__ && SQLITE_ENABLE_BATCH_ATOMIC_WRITE */

    case SQLITE_FCNTL_LOCKSTATE: {
      *(int*)pArg = pFile->eFileLock;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_LAST_ERRNO: {
      *(int*)pArg = pFile->lastErrno;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_CHUNK_SIZE: {
      pFile->szChunk = *(int *)pArg;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_SIZE_HINT: {
      int rc;
      SimulateIOErrorBenign(1);
      rc = fcntlSizeHint(pFile, *(i64 *)pArg);
      SimulateIOErrorBenign(0);
      return rc;
    }
    case SQLITE_FCNTL_PERSIST_WAL: {
      unixModeBit(pFile, UNIXFILE_PERSIST_WAL, (int*)pArg);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_POWERSAFE_OVERWRITE: {
      unixModeBit(pFile, UNIXFILE_PSOW, (int*)pArg);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_VFSNAME: {
      *(char**)pArg = sqlite3_mprintf("%s", pFile->pVfs->zName);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_TEMPFILENAME: {
      char *zTFile = sqlite3_malloc64( pFile->pVfs->mxPathname );
      if( zTFile ){
        unixGetTempname(pFile->pVfs->mxPathname, zTFile);
        *(char**)pArg = zTFile;
      }
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_HAS_MOVED: {
      *(int*)pArg = fileHasMoved(pFile);
      return SQLITE_OK;
    }
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
    case SQLITE_FCNTL_LOCK_TIMEOUT: {
      pFile->iBusyTimeout = *(int*)pArg;
      return SQLITE_OK;
    }
#endif
#if SQLITE_MAX_MMAP_SIZE>0
    case SQLITE_FCNTL_MMAP_SIZE: {
      i64 newLimit = *(i64*)pArg;
      int rc = SQLITE_OK;
      if( newLimit>sqlite3GlobalConfig.mxMmap ){
        newLimit = sqlite3GlobalConfig.mxMmap;
      }

      /* The value of newLimit may be eventually cast to (size_t) and passed
      ** to mmap(). Restrict its value to 2GB if (size_t) is not at least a
      ** 64-bit type. */
      if( newLimit>0 && sizeof(size_t)<8 ){
        newLimit = (newLimit & 0x7FFFFFFF);
      }

      *(i64*)pArg = pFile->mmapSizeMax;
      if( newLimit>=0 && newLimit!=pFile->mmapSizeMax && pFile->nFetchOut==0 ){
        pFile->mmapSizeMax = newLimit;
        if( pFile->mmapSize>0 ){
          unixUnmapfile(pFile);
          rc = unixMapfile(pFile, -1);
        }
      }
      return rc;
    }
#endif
#ifdef SQLITE_DEBUG
    /* The pager calls this method to signal that it has done
    ** a rollback and that the database is therefore unchanged and
    ** it hence it is OK for the transaction change counter to be
    ** unchanged.
    */
    case SQLITE_FCNTL_DB_UNCHANGED: {
      ((unixFile*)id)->dbUpdate = 0;
      return SQLITE_OK;
    }
#endif
#if SQLITE_ENABLE_LOCKING_STYLE && defined(__APPLE__)
    case SQLITE_FCNTL_SET_LOCKPROXYFILE:
    case SQLITE_FCNTL_GET_LOCKPROXYFILE: {
      return proxyFileControl(id,op,pArg);
    }
#endif /* SQLITE_ENABLE_LOCKING_STYLE && defined(__APPLE__) */
  }
  return SQLITE_NOTFOUND;
}